

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O2

bool binlog::operator==(ClockSync *a,ClockSync *b)

{
  __type _Var1;
  
  if ((((a->clockValue == b->clockValue) && (a->clockFrequency == b->clockFrequency)) &&
      (a->nsSinceEpoch == b->nsSinceEpoch)) && (a->tzOffset == b->tzOffset)) {
    _Var1 = std::operator==(&a->tzName,&b->tzName);
    return _Var1;
  }
  return false;
}

Assistant:

bool operator==(const ClockSync& a, const ClockSync& b)
{
  return a.clockValue == b.clockValue
    &&   a.clockFrequency == b.clockFrequency
    &&   a.nsSinceEpoch == b.nsSinceEpoch
    &&   a.tzOffset == b.tzOffset
    &&   a.tzName == b.tzName;
}